

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O3

bool __thiscall
SslTcpSocketImpl::AddServerCertificate
          (SslTcpSocketImpl *this,char *szCAcertificate,char *szHostCertificate,char *szHostKey,
          char *szDhParamFileName)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  SslServerContext local_90;
  
  OpenSSLWrapper::SslServerContext::SslServerContext(&local_90);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_pServerCtx,&local_90);
  local_90.super_SslContext._vptr_SslContext = (_func_int **)&PTR__SslServerContext_00146108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.m_vstrAlpnProtoList);
  OpenSSLWrapper::SslContext::~SslContext(&local_90.super_SslContext);
  iVar3 = OpenSSLWrapper::SslServerContext::SetCertificates
                    ((this->m_pServerCtx).
                     super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,szCAcertificate,
                     szHostCertificate,szHostKey);
  if (iVar3 < 1) {
LAB_0010fc3e:
    pSVar1 = (this->m_pServerCtx).
             super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_pServerCtx).
    super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
    (**pSVar1[-1].super_SslContext._vptr_SslContext)();
    bVar2 = false;
  }
  else {
    if (szDhParamFileName != (char *)0x0) {
      bVar2 = OpenSSLWrapper::SslServerContext::SetDhParamFile
                        ((this->m_pServerCtx).
                         super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,szDhParamFileName);
      if (!bVar2) goto LAB_0010fc3e;
    }
    OpenSSLWrapper::SslServerContext::AddVirtualHost
              ((this->m_pServerCtx).
               super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,&this->m_pServerCtx);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SslTcpSocketImpl::AddServerCertificate(const char* szCAcertificate, const char* szHostCertificate, const char* szHostKey, const char* szDhParamFileName)
{
    m_pServerCtx.emplace_back(SslServerContext());
    if (m_pServerCtx.back().SetCertificates(szCAcertificate, szHostCertificate, szHostKey) > 0)
    {
        if (szDhParamFileName == nullptr || m_pServerCtx.back().SetDhParamFile(szDhParamFileName) == true)
        {
            m_pServerCtx.back().AddVirtualHost(&m_pServerCtx);
            return true;
        }
    }

    m_pServerCtx.pop_back();
    return false;
}